

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O0

void __thiscall
pstore::indirect_string_adder::indirect_string_adder
          (indirect_string_adder *this,size_t expected_size)

{
  size_t expected_size_local;
  indirect_string_adder *this_local;
  
  std::
  vector<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ::vector(&this->views_);
  std::
  vector<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ::reserve(&this->views_,expected_size);
  return;
}

Assistant:

indirect_string_adder::indirect_string_adder (std::size_t const expected_size) {
        views_.reserve (expected_size);
    }